

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

WeierstrassCurve * wcurve(void)

{
  mp_int *p;
  mp_int *a;
  mp_int *b;
  mp_int *nonsquare_mod_p;
  WeierstrassCurve *pWVar1;
  
  p = mp_from_hex("c19337603dc856acf31e01375a696fdf5451");
  a = mp_from_hex("864946f50eecca4cde7abad4865e34be8f67");
  b = mp_from_hex("6a5bf56db3a03ba91cfbf3241916c90feeca");
  nonsquare_mod_p = mp_from_integer(3);
  pWVar1 = ecc_weierstrass_curve(p,a,b,nonsquare_mod_p);
  mp_free(p);
  mp_free(a);
  mp_free(b);
  mp_free(nonsquare_mod_p);
  return pWVar1;
}

Assistant:

static WeierstrassCurve *wcurve(void)
{
    mp_int *p = MP_LITERAL(0xc19337603dc856acf31e01375a696fdf5451);
    mp_int *a = MP_LITERAL(0x864946f50eecca4cde7abad4865e34be8f67);
    mp_int *b = MP_LITERAL(0x6a5bf56db3a03ba91cfbf3241916c90feeca);
    mp_int *nonsquare = mp_from_integer(3);
    WeierstrassCurve *wc = ecc_weierstrass_curve(p, a, b, nonsquare);
    mp_free(p);
    mp_free(a);
    mp_free(b);
    mp_free(nonsquare);
    return wc;
}